

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O0

void readlargeobjects(uint32 numlargeobjects,uint32 numsmallobjects,uint8 **ptr,uint32 *len,
                     MOJOSHADER_effect *effect,char *profile,MOJOSHADER_swizzle *swiz,uint swizcount
                     ,MOJOSHADER_samplerMap *smap,uint smapcount,MOJOSHADER_malloc m,
                     MOJOSHADER_free f,void *d)

{
  uint32 uVar1;
  uint32 uVar2;
  uint32 uVar3;
  uint32 uVar4;
  uint32 bufsize;
  int iVar5;
  int iVar6;
  uint uVar7;
  MOJOSHADER_effectObject *pMVar8;
  void *pvVar9;
  MOJOSHADER_preshader *pMVar10;
  MOJOSHADER_parseData *pMVar11;
  uint32 blocklen;
  char *str;
  int par;
  uint32 curSampler;
  char mainfn [32];
  char *array;
  uint32 end;
  uint32 start;
  char *emitter;
  MOJOSHADER_effectObject *object;
  uint32 objectIndex;
  uint32 length;
  uint32 type;
  uint32 state;
  uint32 index;
  uint32 technique;
  int numobjects;
  int j;
  int i;
  char *profile_local;
  MOJOSHADER_effect *effect_local;
  uint32 *len_local;
  uint8 **ptr_local;
  uint32 numsmallobjects_local;
  uint32 numlargeobjects_local;
  
  if (numlargeobjects != 0) {
    for (numobjects = numsmallobjects + 1; numobjects < (int)(numsmallobjects + numlargeobjects + 1)
        ; numobjects = numobjects + 1) {
      uVar1 = readui32(ptr,len);
      uVar2 = readui32(ptr,len);
      readui32(ptr,len);
      uVar3 = readui32(ptr,len);
      uVar4 = readui32(ptr,len);
      bufsize = readui32(ptr,len);
      if (uVar1 == 0xffffffff) {
        object._4_4_ = **(MOJOSHADER_zBufferType **)
                         ((long)effect->params[uVar2].value.field_4.values +
                         (ulong)uVar3 * 0x48 + 0x40);
      }
      else {
        object._4_4_ = *effect->techniques[uVar1].passes[uVar2].states[uVar3].value.field_4.
                        valuesZBT;
      }
      pMVar8 = effect->objects + object._4_4_;
      if ((pMVar8->type == MOJOSHADER_SYMTYPE_PIXELSHADER) ||
         (pMVar8->type == MOJOSHADER_SYMTYPE_VERTEXSHADER)) {
        *(uint32 *)((long)pMVar8 + 4) = uVar1;
        *(uint32 *)((long)pMVar8 + 8) = uVar2;
        if (uVar4 == 2) {
          *(int *)((long)pMVar8 + 0xc) = 1;
          iVar6 = *(int *)*ptr;
          mainfn._24_8_ = readstring(*ptr,0,m,d);
          *(int *)((long)pMVar8 + 0x20) = 1;
          pvVar9 = (*m)(4,d);
          *(void **)((long)pMVar8 + 0x28) = pvVar9;
          iVar5 = findparameter(effect->params,effect->param_count,(char *)mainfn._24_8_);
          **(int **)((long)pMVar8 + 0x28) = iVar5;
          (*f)((void *)mainfn._24_8_,d);
          pMVar10 = MOJOSHADER_parsePreshader(*ptr + (iVar6 + 4),bufsize - 0x10,m,f,d);
          *(MOJOSHADER_preshader **)((long)pMVar8 + 0x40) = pMVar10;
          *(int *)((long)pMVar8 + 0x10) = *(int *)(*(long *)((long)pMVar8 + 0x40) + 0x14);
          pvVar9 = (*m)(*(int *)((long)pMVar8 + 0x10) << 2,d);
          *(void **)((long)pMVar8 + 0x18) = pvVar9;
          for (technique = 0; technique < *(uint *)(*(long *)((long)pMVar8 + 0x40) + 0x14);
              technique = technique + 1) {
            iVar6 = findparameter(effect->params,effect->param_count,
                                  *(char **)(*(long *)(*(long *)((long)pMVar8 + 0x40) + 0x18) +
                                            (long)(int)technique * 0x38));
            *(int *)(*(long *)((long)pMVar8 + 0x18) + (long)(int)technique * 4) = iVar6;
          }
        }
        else {
          snprintf((char *)&par,0x20,"ShaderFunction%u",(ulong)object._4_4_);
          pMVar11 = MOJOSHADER_parse(profile,(char *)&par,*ptr,bufsize,swiz,swizcount,smap,smapcount
                                     ,m,f,d);
          *(MOJOSHADER_parseData **)((long)pMVar8 + 0x40) = pMVar11;
          for (technique = 0; (int)technique < *(int *)(*(long *)((long)pMVar8 + 0x40) + 0xa0);
              technique = technique + 1) {
            if (*(int *)(*(long *)(*(long *)((long)pMVar8 + 0x40) + 0xa8) +
                         (long)(int)technique * 0x38 + 8) == 3) {
              *(int *)((long)pMVar8 + 0x30) = *(int *)((long)pMVar8 + 0x30) + 1;
            }
          }
          *(int *)((long)pMVar8 + 0x20) = *(int *)(*(long *)((long)pMVar8 + 0x40) + 0xa0);
          pvVar9 = (*m)(*(int *)((long)pMVar8 + 0x20) << 2,d);
          *(void **)((long)pMVar8 + 0x28) = pvVar9;
          pvVar9 = (*m)(*(int *)((long)pMVar8 + 0x30) * 0x18,d);
          *(void **)((long)pMVar8 + 0x38) = pvVar9;
          str._4_4_ = 0;
          for (technique = 0; (int)technique < *(int *)(*(long *)((long)pMVar8 + 0x40) + 0xa0);
              technique = technique + 1) {
            iVar6 = findparameter(effect->params,effect->param_count,
                                  *(char **)(*(long *)(*(long *)((long)pMVar8 + 0x40) + 0xa8) +
                                            (long)(int)technique * 0x38));
            *(int *)(*(long *)((long)pMVar8 + 0x28) + (long)(int)technique * 4) = iVar6;
            if (*(int *)(*(long *)(*(long *)((long)pMVar8 + 0x40) + 0xa8) +
                         (long)(int)technique * 0x38 + 8) == 3) {
              *(undefined8 *)(*(long *)((long)pMVar8 + 0x38) + (ulong)str._4_4_ * 0x18) =
                   *(undefined8 *)
                    (*(long *)(*(long *)((long)pMVar8 + 0x40) + 0xa8) + (long)(int)technique * 0x38)
              ;
              *(undefined4 *)(*(long *)((long)pMVar8 + 0x38) + (ulong)str._4_4_ * 0x18 + 8) =
                   *(undefined4 *)
                    (*(long *)(*(long *)((long)pMVar8 + 0x40) + 0xa8) + (long)(int)technique * 0x38
                    + 0xc);
              *(uint *)(*(long *)((long)pMVar8 + 0x38) + (ulong)str._4_4_ * 0x18 + 0xc) =
                   effect->params[iVar6].value.value_count;
              *(anon_union_8_20_d40dc30a_for_MOJOSHADER_effectValue_4 *)
               (*(long *)((long)pMVar8 + 0x38) + (ulong)str._4_4_ * 0x18 + 0x10) =
                   effect->params[iVar6].value.field_4;
              str._4_4_ = str._4_4_ + 1;
            }
          }
          if (*(long *)(*(long *)((long)pMVar8 + 0x40) + 0xb0) != 0) {
            *(int *)((long)pMVar8 + 0x10) =
                 *(int *)(*(long *)(*(long *)((long)pMVar8 + 0x40) + 0xb0) + 0x14);
            pvVar9 = (*m)(*(int *)((long)pMVar8 + 0x10) << 2,d);
            *(void **)((long)pMVar8 + 0x18) = pvVar9;
            for (technique = 0;
                technique < *(uint *)(*(long *)(*(long *)((long)pMVar8 + 0x40) + 0xb0) + 0x14);
                technique = technique + 1) {
              iVar6 = findparameter(effect->params,effect->param_count,
                                    *(char **)(*(long *)(*(long *)(*(long *)((long)pMVar8 + 0x40) +
                                                                  0xb0) + 0x18) +
                                              (long)(int)technique * 0x38));
              *(int *)(*(long *)((long)pMVar8 + 0x18) + (long)(int)technique * 4) = iVar6;
            }
          }
        }
      }
      else if ((((pMVar8->type == MOJOSHADER_SYMTYPE_SAMPLER) ||
                (pMVar8->type == MOJOSHADER_SYMTYPE_SAMPLER1D)) ||
               (pMVar8->type == MOJOSHADER_SYMTYPE_SAMPLER2D)) ||
              ((pMVar8->type == MOJOSHADER_SYMTYPE_SAMPLER3D ||
               (pMVar8->type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)))) {
        if (bufsize != 0) {
          pvVar9 = (*m)(bufsize,d);
          memcpy(pvVar9,*ptr,(ulong)bufsize);
          *(void **)((long)pMVar8 + 8) = pvVar9;
        }
      }
      else if (pMVar8->type != MOJOSHADER_SYMTYPE_VOID) {
        __assert_fail("0 && \"Large object type unknown!\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                      ,0x33a,
                      "void readlargeobjects(const uint32, const uint32, const uint8 **, uint32 *, MOJOSHADER_effect *, const char *, const MOJOSHADER_swizzle *, const unsigned int, const MOJOSHADER_samplerMap *, const unsigned int, MOJOSHADER_malloc, MOJOSHADER_free, void *)"
                     );
      }
      uVar7 = (bufsize + 3) - (bufsize - 1 & 3);
      *ptr = *ptr + uVar7;
      *len = *len - uVar7;
    }
  }
  return;
}

Assistant:

static void readlargeobjects(const uint32 numlargeobjects,
                             const uint32 numsmallobjects,
                             const uint8 **ptr,
                             uint32 *len,
                             MOJOSHADER_effect *effect,
                             const char *profile,
                             const MOJOSHADER_swizzle *swiz,
                             const unsigned int swizcount,
                             const MOJOSHADER_samplerMap *smap,
                             const unsigned int smapcount,
                             MOJOSHADER_malloc m,
                             MOJOSHADER_free f,
                             void *d)
{
    int i, j;
    if (numlargeobjects == 0) return;

    int numobjects = numsmallobjects + numlargeobjects + 1;
    for (i = numsmallobjects + 1; i < numobjects; i++)
    {
        const uint32 technique = readui32(ptr, len);
        const uint32 index = readui32(ptr, len);
        /*const uint32 FIXME =*/ readui32(ptr, len);
        const uint32 state = readui32(ptr, len);
        const uint32 type = readui32(ptr, len);
        const uint32 length = readui32(ptr, len);

        uint32 objectIndex;
        if (technique == -1)
            objectIndex = effect->params[index].value.valuesSS[state].value.valuesI[0];
        else
            objectIndex = effect->techniques[technique].passes[index].states[state].value.valuesI[0];

        MOJOSHADER_effectObject *object = &effect->objects[objectIndex];
        if (object->type == MOJOSHADER_SYMTYPE_PIXELSHADER
         || object->type == MOJOSHADER_SYMTYPE_VERTEXSHADER)
        {
            object->shader.technique = technique;
            object->shader.pass = index;

            const char *emitter = profile;
            if (type == 2)
            {
                /* This is a standalone preshader!
                 * It exists solely for effect passes that do not use a single
                 * vertex/fragment shader.
                 */
                object->shader.is_preshader = 1;
                const uint32 start = *((uint32 *) *ptr) + 4;
                const uint32 end = 16; // FIXME: Why? -flibit
                const char *array = readstring(*ptr, 0, m, d);
                object->shader.param_count = 1;
                object->shader.params = (uint32 *) m(sizeof (uint32), d);
                object->shader.params[0] = findparameter(effect->params,
                                                         effect->param_count,
                                                         array);
                f((void *) array, d);
                object->shader.preshader = MOJOSHADER_parsePreshader(*ptr + start, length - end,
                                                                     m, f, d);
                // !!! FIXME: check for errors.
                object->shader.preshader_param_count = object->shader.preshader->symbol_count;
                object->shader.preshader_params = (uint32 *) m(object->shader.preshader_param_count * sizeof (uint32), d);
                for (j = 0; j < object->shader.preshader->symbol_count; j++)
                {
                    object->shader.preshader_params[j] = findparameter(effect->params,
                                                                       effect->param_count,
                                                                       object->shader.preshader->symbols[j].name);
                } // for
            } // if
            else
            {
                char mainfn[32];
                snprintf(mainfn, sizeof (mainfn), "ShaderFunction%u", (unsigned int) objectIndex);
                object->shader.shader = MOJOSHADER_parse(emitter, mainfn, *ptr, length,
                                                         swiz, swizcount, smap, smapcount,
                                                         m, f, d);
                // !!! FIXME: check for errors.
                for (j = 0; j < object->shader.shader->symbol_count; j++)
                    if (object->shader.shader->symbols[j].register_set == MOJOSHADER_SYMREGSET_SAMPLER)
                        object->shader.sampler_count++;
                object->shader.param_count = object->shader.shader->symbol_count;
                object->shader.params = (uint32 *) m(object->shader.param_count * sizeof (uint32), d);
                object->shader.samplers = (MOJOSHADER_samplerStateRegister *) m(object->shader.sampler_count * sizeof (MOJOSHADER_samplerStateRegister), d);
                uint32 curSampler = 0;
                for (j = 0; j < object->shader.shader->symbol_count; j++)
                {
                    int par = findparameter(effect->params,
                                            effect->param_count,
                                            object->shader.shader->symbols[j].name);
                    object->shader.params[j] = par;
                    if (object->shader.shader->symbols[j].register_set == MOJOSHADER_SYMREGSET_SAMPLER)
                    {
                        object->shader.samplers[curSampler].sampler_name = object->shader.shader->symbols[j].name;
                        object->shader.samplers[curSampler].sampler_register = object->shader.shader->symbols[j].register_index;
                        object->shader.samplers[curSampler].sampler_state_count = effect->params[par].value.value_count;
                        object->shader.samplers[curSampler].sampler_states = effect->params[par].value.valuesSS;
                        curSampler++;
                    } // if
                } // for
                if (object->shader.shader->preshader)
                {
                    object->shader.preshader_param_count = object->shader.shader->preshader->symbol_count;
                    object->shader.preshader_params = (uint32 *) m(object->shader.preshader_param_count * sizeof (uint32), d);
                    for (j = 0; j < object->shader.shader->preshader->symbol_count; j++)
                    {
                        object->shader.preshader_params[j] = findparameter(effect->params,
                                                                           effect->param_count,
                                                                           object->shader.shader->preshader->symbols[j].name);
                    } // for
                } // if
            }
        } // if
        else if (object->type == MOJOSHADER_SYMTYPE_SAMPLER
              || object->type == MOJOSHADER_SYMTYPE_SAMPLER1D
              || object->type == MOJOSHADER_SYMTYPE_SAMPLER2D
              || object->type == MOJOSHADER_SYMTYPE_SAMPLER3D
              || object->type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)
        {
            if (length > 0)
            {
                char *str = (char *) m(length, d);
                memcpy(str, *ptr, length);
                object->mapping.name = str;
            } // if
        } // else if
        else if (object->type != MOJOSHADER_SYMTYPE_VOID) // FIXME: Why? -flibit
        {
            assert(0 && "Large object type unknown!");
        } // else

        /* Object block is always a multiple of four */
        const uint32 blocklen = (length + 3) - ((length - 1) % 4);
        *ptr += blocklen;
        *len -= blocklen;
    } // for
}